

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

char * __thiscall
sentencepiece::SentencePieceText::_InternalParse
          (SentencePieceText *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint uVar2;
  uint32 *puVar3;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar4;
  EpsCopyInputStream *in_RDX;
  uint32 *in_RSI;
  long in_RDI;
  float fVar5;
  uint64 unaff_retaddr;
  ExtensionSet *in_stack_00000008;
  string *str;
  uint32 tag;
  HasBits has_bits;
  ParseContext *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  ParseContext *in_stack_ffffffffffffff68;
  SentencePieceText_SentencePiece *in_stack_ffffffffffffff70;
  ParseContext *in_stack_ffffffffffffff78;
  uint32 *in_stack_ffffffffffffff80;
  EpsCopyInputStream *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  HasBits *local_58;
  uint local_48;
  HasBits local_44;
  EpsCopyInputStream *local_40;
  uint32 *local_38;
  HasBits *local_28;
  ParseContext *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  ParseContext *in_stack_fffffffffffffff0;
  ParseContext *in_stack_fffffffffffffff8;
  
  local_58 = &local_44;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_28 = local_58;
  do {
    local_58->has_bits_[0] = 0;
    local_58 = local_58 + 1;
  } while (local_58 != (HasBits *)&local_40);
LAB_0044f196:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done
                      ((ParseContext *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                       ,(char **)in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0044f4b8;
    puVar3 = (uint32 *)
             google::protobuf::internal::ReadTag
                       ((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                        (uint32)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    if (puVar3 == (uint32 *)0x0) goto LAB_0044f4d8;
    uVar2 = local_48 >> 3;
    local_38 = puVar3;
    if (uVar2 == 1) {
      if ((local_48 & 0xff) != 10) goto LAB_0044f35f;
      _internal_mutable_text_abi_cxx11_
                ((SentencePieceText *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
      ;
      local_38 = (uint32 *)
                 google::protobuf::internal::InlineGreedyStringParser
                           ((string *)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff58);
    }
    else {
      if (uVar2 == 2) {
        if ((local_48 & 0xff) == 0x12) {
          local_38 = (uint32 *)((long)puVar3 + -1);
          do {
            local_38 = (uint32 *)((long)local_38 + 1);
            in_stack_ffffffffffffff88 = local_40;
            _internal_add_pieces((SentencePieceText *)0x44f2b6);
            local_38 = (uint32 *)
                       google::protobuf::internal::ParseContext::
                       ParseMessage<sentencepiece::SentencePieceText_SentencePiece>
                                 (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  (char *)in_stack_ffffffffffffff68);
            if (local_38 == (uint32 *)0x0) goto LAB_0044f4d8;
            bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                              (local_40,(char *)local_38);
          } while ((bVar1) &&
                  (bVar1 = google::protobuf::internal::ExpectTag<18u>((char *)local_38), bVar1));
          goto LAB_0044f196;
        }
      }
      else if ((uVar2 == 3) && ((local_48 & 0xff) == 0x1d)) {
        _Internal::set_has_score(&local_44);
        fVar5 = google::protobuf::internal::UnalignedLoad<float>
                          ((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        *(float *)(in_RDI + 0x50) = fVar5;
        local_38 = local_38 + 1;
        goto LAB_0044f196;
      }
LAB_0044f35f:
      if (((local_48 & 7) == 4) || (local_48 == 0)) {
        google::protobuf::internal::EpsCopyInputStream::SetLastTag(local_40,local_48);
        goto LAB_0044f4b8;
      }
      if (local_48 < 0x640) {
        in_stack_ffffffffffffff68 = (ParseContext *)(in_RDI + 8);
        in_stack_ffffffffffffff64 = local_48;
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffff68;
        in_stack_fffffffffffffff0 = in_stack_ffffffffffffff68;
        in_stack_fffffffffffffff8 = in_stack_ffffffffffffff68;
        if (((uint)(in_stack_ffffffffffffff68->super_EpsCopyInputStream).limit_end_ & 1) == 1) {
          pCVar4 = google::protobuf::internal::InternalMetadata::
                   PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                             ((InternalMetadata *)in_stack_ffffffffffffff68);
          in_stack_ffffffffffffffe8 = &pCVar4->unknown_fields;
        }
        else {
          in_stack_ffffffffffffffe8 =
               google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>
                         ((InternalMetadata *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
        }
        local_38 = (uint32 *)
                   google::protobuf::internal::UnknownFieldParse
                             ((uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                              (string *)in_stack_ffffffffffffff68,
                              (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff58);
      }
      else {
        in_stack_ffffffffffffff70 = (SentencePieceText_SentencePiece *)(in_RDI + 0x10);
        in_stack_ffffffffffffff78 = (ParseContext *)(ulong)local_48;
        internal_default_instance();
        local_38 = (uint32 *)
                   google::protobuf::internal::ExtensionSet::ParseField
                             (in_stack_00000008,unaff_retaddr,(char *)in_stack_fffffffffffffff8,
                              (MessageLite *)in_stack_fffffffffffffff0,
                              (InternalMetadata *)in_stack_ffffffffffffffe8,
                              in_stack_ffffffffffffffe0);
        in_stack_ffffffffffffff80 = puVar3;
      }
    }
    if (local_38 == (uint32 *)0x0) {
LAB_0044f4d8:
      local_38 = (uint32 *)0x0;
LAB_0044f4b8:
      google::protobuf::internal::HasBits<1UL>::Or((HasBits<1UL> *)(in_RDI + 0x28),&local_44);
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* SentencePieceText::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string text = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_text();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .sentencepiece.SentencePieceText.SentencePiece pieces = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_pieces(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional float score = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 29)) {
          _Internal::set_has_score(&has_bits);
          score_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}